

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O2

service * asio::detail::service_registry::
          create<asio::detail::resolver_service<asio::ip::tcp>,asio::execution_context>(void *owner)

{
  resolver_service<asio::ip::tcp> *this;
  
  this = (resolver_service<asio::ip::tcp> *)operator_new(0x68);
  resolver_service<asio::ip::tcp>::resolver_service(this,(execution_context *)owner);
  return (service *)this;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}